

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O0

void internal_exr_free(void *ptr)

{
  void *in_RDI;
  
  if (in_RDI != (void *)0x0) {
    if (_glob_free_func == (exr_memory_free_func_t)0x0) {
      free(in_RDI);
    }
    else {
      (*_glob_free_func)(in_RDI);
    }
  }
  return;
}

Assistant:

void
internal_exr_free (void* ptr)
{
    if (!ptr) return;

    if (_glob_free_func) { (*_glob_free_func) (ptr); }
    else
    {
#ifdef _WIN32
        HeapFree (GetProcessHeap (), 0, ptr);
#else
        free (ptr);
#endif
    }
}